

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

CalloutListEntry * onig_reg_callout_list_at(regex_t *reg,int num)

{
  RegexExt *pRVar1;
  
  pRVar1 = reg->extp;
  if ((0 < num && pRVar1 != (RegexExt *)0x0) && (num <= pRVar1->callout_num)) {
    return pRVar1->callout_list + ((ulong)(uint)num - 1);
  }
  return (CalloutListEntry *)0x0;
}

Assistant:

extern CalloutListEntry*
onig_reg_callout_list_at(regex_t* reg, int num)
{
  RegexExt* ext = reg->extp;
  CHECK_NULL_RETURN(ext);

  if (num <= 0 || num > ext->callout_num)
    return 0;

  num--;
  return ext->callout_list + num;
}